

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O0

_Fact * __thiscall r_exec::_Fact::get_absentee(_Fact *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar3;
  uint64_t uVar4;
  size_t in_RSI;
  _Fact *local_18;
  _Fact *absentee;
  _Fact *this_local;
  
  bVar1 = is_fact(this);
  if (bVar1) {
    local_18 = (_Fact *)AntiFact::operator_new((AntiFact *)0x150,in_RSI);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar3 = get_after(this);
    uVar4 = get_before(this);
    AntiFact::AntiFact((AntiFact *)local_18,(Code *)CONCAT44(extraout_var,iVar2),uVar3,uVar4,1.0,1.0
                      );
  }
  else {
    local_18 = (_Fact *)Fact::operator_new((Fact *)0x150,in_RSI);
    iVar2 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[9])(this,0);
    uVar3 = get_after(this);
    uVar4 = get_before(this);
    Fact::Fact((Fact *)local_18,(Code *)CONCAT44(extraout_var_00,iVar2),uVar3,uVar4,1.0,1.0);
  }
  return local_18;
}

Assistant:

_Fact *_Fact::get_absentee() const
{
    _Fact *absentee;

    if (is_fact()) {
        absentee = new AntiFact(get_reference(0), get_after(), get_before(), 1, 1);
    } else {
        absentee = new Fact(get_reference(0), get_after(), get_before(), 1, 1);
    }

    return absentee;
}